

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcSaucy.c
# Opt level: O2

int refine_cell(saucy *s,coloring *c,_func_int_saucy_ptr_coloring_ptr_int *refine)

{
  uint n;
  int *a;
  uint uVar1;
  ulong uVar2;
  int iVar3;
  ulong uVar4;
  long lVar5;
  
  if (1 < s->lev) {
    a = s->clist;
    n = s->csize;
    iVar3 = 0;
    for (uVar1 = n; 1 < (int)uVar1; uVar1 = uVar1 >> 1) {
      iVar3 = iVar3 + 2;
    }
    introsort_loop(a,n,iVar3);
    for (uVar2 = 1; (long)uVar2 < (long)(int)n; uVar2 = uVar2 + 1) {
      iVar3 = a[uVar2];
      for (uVar4 = uVar2 & 0xffffffff; 0 < (int)uVar4; uVar4 = (ulong)((int)uVar4 - 1)) {
        if (a[uVar4 - 1] <= iVar3) goto LAB_002807d9;
        a[uVar4] = a[uVar4 - 1];
      }
      uVar4 = 0;
LAB_002807d9:
      a[uVar4] = iVar3;
    }
  }
  iVar3 = 1;
  for (lVar5 = 0; (iVar3 != 0 && (lVar5 < s->csize)); lVar5 = lVar5 + 1) {
    iVar3 = (*refine)(s,c,s->clist[lVar5]);
  }
  for (lVar5 = 0; lVar5 < s->csize; lVar5 = lVar5 + 1) {
    s->conncnts[s->clist[lVar5]] = 0;
  }
  s->csize = 0;
  return iVar3;
}

Assistant:

static int
refine_cell(struct saucy *s, struct coloring *c,
    int (*refine)(struct saucy *, struct coloring *, int))
{
    int i, cf, ret = 1;

    /*
     * The connected list must be consistent.  This is for
     * detecting mappings across nodes at a given level.  However,
     * at the root of the tree, we never have to map with another
     * node, so we lack this consistency constraint in that case.
     */
    if (s->lev > 1) introsort(s->clist, s->csize);

    /* Now iterate over the marked cells */
    for (i = 0; ret && i < s->csize; ++i) {
        cf = s->clist[i];
        ret = refine(s, c, cf);
    }

    /* Clear the connected marks */
    for (i = 0; i < s->csize; ++i) {
        cf = s->clist[i];
        s->conncnts[cf] = 0;
    }
    s->csize = 0;
    return ret;
}